

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

domain_manager * __thiscall
cs::domain_manager::add_var<char_const(&)[9]>(domain_manager *this,char (*name) [9],var *val)

{
  bool bVar1;
  domain_type *pdVar2;
  runtime_error *prVar3;
  allocator local_89;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (*this->fiber_stack == (stack_type<cs::domain_type,_std::allocator> *)0x0) {
    pdVar2 = stack_type<cs::domain_type,_std::allocator>::top(&this->m_data);
    std::__cxx11::string::string((string *)&local_88,*name,(allocator *)&local_68);
    bVar1 = domain_type::add_var_optimal(pdVar2,&local_88,val,false);
    std::__cxx11::string::~string((string *)&local_88);
    if (!bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_48,*name,&local_89);
      std::operator+(&local_68,"Target domain exist variable \"",&local_48);
      std::operator+(&local_88,&local_68,"\".");
      runtime_error::runtime_error(prVar3,&local_88);
      __cxa_throw(prVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  else {
    pdVar2 = stack_type<cs::domain_type,_std::allocator>::top(*this->fiber_stack);
    std::__cxx11::string::string((string *)&local_88,*name,(allocator *)&local_68);
    bVar1 = domain_type::add_var_optimal(pdVar2,&local_88,val,false);
    std::__cxx11::string::~string((string *)&local_88);
    if (!bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_48,*name,&local_89);
      std::operator+(&local_68,"Target domain exist variable \"",&local_48);
      std::operator+(&local_88,&local_68,"\".");
      runtime_error::runtime_error(prVar3,&local_88);
      __cxa_throw(prVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  return this;
}

Assistant:

domain_manager &add_var(T &&name, const var &val)
		{
			if (fiber_stack != nullptr) {
				if (!fiber_stack->top().add_var_optimal(name, val))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
			else {
				if (!m_data.top().add_var_optimal(name, val))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
			return *this;
		}